

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber_test.cc
# Opt level: O0

void KyberFileTest(FileTest *t)

{
  bool bVar1;
  char *pcVar2;
  uchar *entropy;
  CTR_DRBG_STATE *__p;
  pointer pcVar3;
  char *in_R9;
  AssertHelper local_5848;
  Message local_5840;
  Span<const_unsigned_char> local_5838;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5828;
  Span<const_unsigned_char> local_5810;
  Bytes local_5800;
  Span<const_unsigned_char> local_57f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_57e0;
  Span<const_unsigned_char> local_57c8;
  Bytes local_57b8;
  undefined1 local_57a8 [8];
  AssertionResult gtest_ar_8;
  uint8_t corrupted_decapsulated_key [32];
  uint8_t corrupted_ciphertext [1088];
  Message local_5330;
  Span<const_unsigned_char> local_5328;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5318;
  Span<const_unsigned_char> local_5300;
  Bytes local_52f0;
  Span<const_unsigned_char> local_52e0;
  Bytes local_52d0;
  undefined1 local_52c0 [8];
  AssertionResult gtest_ar_7;
  Message local_52a8;
  Span<const_unsigned_char> local_52a0;
  Bytes local_5290;
  Span<const_unsigned_char> local_5280;
  Bytes local_5270;
  undefined1 local_5260 [8];
  AssertionResult gtest_ar_6;
  Message local_5248;
  Span<const_unsigned_char> local_5240;
  Bytes local_5230;
  Span<const_unsigned_char> local_5220;
  Bytes local_5210;
  undefined1 local_5200 [8];
  AssertionResult gtest_ar_5;
  Message local_51e8;
  Span<const_unsigned_char> local_51e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_51d0;
  Span<const_unsigned_char> local_51b8;
  Bytes local_51a8;
  Span<const_unsigned_char> local_5198;
  Bytes local_5188;
  undefined1 local_5178 [8];
  AssertionResult gtest_ar_4;
  Message local_5160;
  Span<const_unsigned_char> local_5158;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5148;
  Span<const_unsigned_char> local_5130;
  Bytes local_5120;
  Span<const_unsigned_char> local_5110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_5100;
  Span<const_unsigned_char> local_50e8;
  Bytes local_50d8;
  undefined1 local_50c8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_5098;
  Message local_5090;
  int local_5084;
  undefined1 local_5080 [8];
  AssertionResult gtest_ar__12;
  CBS encoded_public_key_cbs;
  AssertHelper local_5040;
  Message local_5038;
  int local_502c;
  undefined1 local_5028 [8];
  AssertionResult gtest_ar__11;
  CBB cbb;
  Message local_4fe0;
  Span<const_unsigned_char> local_4fd8;
  Bytes local_4fc8;
  Span<const_unsigned_char> local_4fb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4fa8;
  Span<const_unsigned_char> local_4f90;
  Bytes local_4f80;
  undefined1 local_4f70 [8];
  AssertionResult gtest_ar_2;
  Message local_4f58;
  Span<const_unsigned_char> local_4f50;
  Bytes local_4f40;
  Span<const_unsigned_char> local_4f30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4f20;
  Span<const_unsigned_char> local_4f08;
  Bytes local_4ef8;
  undefined1 local_4ee8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4eb8;
  Message local_4eb0;
  int local_4ea4;
  undefined1 local_4ea0 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_4e70;
  Message local_4e68;
  int local_4e5c;
  undefined1 local_4e58 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_4e28;
  Message local_4e20;
  int local_4e14;
  undefined1 local_4e10 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_4de0;
  Message local_4dd8;
  undefined1 local_4dd0 [8];
  AssertionResult gtest_ar__7;
  UniquePtr<CTR_DRBG_STATE> state;
  Message local_4db0;
  unsigned_long local_4da8;
  size_type local_4da0;
  undefined1 local_4d98 [8];
  AssertionResult gtest_ar;
  uint8_t decapsulated_key [32];
  uint8_t encapsulated_key [32];
  uint8_t encap_entropy [32];
  uint8_t gen_key_entropy [64];
  uint8_t ciphertext [1088];
  uint8_t encoded_public_key [1184];
  KYBER_public_key pub;
  uint8_t encoded_private_key [2400];
  KYBER_private_key priv;
  AssertHelper local_3e8;
  Message local_3e0;
  allocator<char> local_3d1;
  string local_3d0;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_378;
  Message local_370;
  allocator<char> local_361;
  string local_360;
  bool local_339;
  undefined1 local_338 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_308;
  Message local_300;
  allocator<char> local_2f1;
  string local_2f0;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_298;
  Message local_290;
  allocator<char> local_281;
  string local_280;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_228;
  Message local_220;
  allocator<char> local_211;
  string local_210;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1b8;
  Message local_1b0;
  allocator<char> local_1a1;
  string local_1a0;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__1;
  string local_160;
  AssertHelper local_140;
  Message local_138;
  allocator<char> local_129;
  string local_128;
  bool local_101;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> given_encap_entropy_pre_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> given_generate_entropy;
  vector<unsigned_char,_std::allocator<unsigned_char>_> shared_secret_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ciphertext_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> private_key_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> public_key_expected;
  vector<unsigned_char,_std::allocator<unsigned_char>_> seed;
  FileTest *t_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &public_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &private_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &ciphertext_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &shared_secret_expected.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &given_generate_entropy.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &given_encap_entropy_pre_hash.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"count",&local_d9);
  FileTest::IgnoreAttribute(t,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"seed",&local_129);
  local_101 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &public_key_expected.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_128);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_100,&local_101,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_160,(internal *)local_100,(AssertionResult *)"t->GetBytes(&seed, \"seed\")",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    testing::Message::~Message(&local_138);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"pk",&local_1a1);
    local_179 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &private_key_expected.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a0)
    ;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_178,&local_179,(type *)0x0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_178,
                 (AssertionResult *)"t->GetBytes(&public_key_expected, \"pk\")","false","true",in_R9
                );
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                 ,0x78,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"sk",&local_211);
      local_1e9 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &ciphertext_expected.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     &local_210);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_1e8,
                   (AssertionResult *)"t->GetBytes(&private_key_expected, \"sk\")","false","true",
                   in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_228,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                   ,0x79,pcVar2);
        testing::internal::AssertHelper::operator=(&local_228,&local_220);
        testing::internal::AssertHelper::~AssertHelper(&local_228);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_220);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"ct",&local_281);
        local_259 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                         &shared_secret_expected.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       &local_280);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_258,&local_259,(type *)0x0);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
        if (!bVar1) {
          testing::Message::Message(&local_290);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_258,
                     (AssertionResult *)"t->GetBytes(&ciphertext_expected, \"ct\")","false","true",
                     in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                     ,0x7a,pcVar2);
          testing::internal::AssertHelper::operator=(&local_298,&local_290);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_290);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"ss",&local_2f1);
          local_2c9 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                           &given_generate_entropy.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         &local_2f0);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator(&local_2f1);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
          if (!bVar1) {
            testing::Message::Message(&local_300);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_2c8,
                       (AssertionResult *)"t->GetBytes(&shared_secret_expected, \"ss\")","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_308,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                       ,0x7b,pcVar2);
            testing::internal::AssertHelper::operator=(&local_308,&local_300);
            testing::internal::AssertHelper::~AssertHelper(&local_308);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_300);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_360,"generateEntropy",&local_361);
            local_339 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&given_encap_entropy_pre_hash.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           &local_360);
            testing::AssertionResult::AssertionResult<bool>
                      ((AssertionResult *)local_338,&local_339,(type *)0x0);
            std::__cxx11::string::~string((string *)&local_360);
            std::allocator<char>::~allocator(&local_361);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
            if (!bVar1) {
              testing::Message::Message(&local_370);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_338,
                         (AssertionResult *)
                         "t->GetBytes(&given_generate_entropy, \"generateEntropy\")","false","true",
                         in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                         ,0x7c,pcVar2);
              testing::internal::AssertHelper::operator=(&local_378,&local_370);
              testing::internal::AssertHelper::~AssertHelper(&local_378);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_370);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_3d0,"encapEntropyPreHash",&local_3d1);
              local_3a9 = FileTest::GetBytes(t,(vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)local_b8,&local_3d0);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
              std::__cxx11::string::~string((string *)&local_3d0);
              std::allocator<char>::~allocator(&local_3d1);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
              if (!bVar1) {
                testing::Message::Message(&local_3e0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)((long)&priv.opaque + 0x1e58),(internal *)local_3a8,
                           (AssertionResult *)
                           "t->GetBytes(&given_encap_entropy_pre_hash, \"encapEntropyPreHash\")",
                           "false","true",in_R9);
                pcVar2 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3e8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                           ,0x7e,pcVar2);
                testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
                testing::internal::AssertHelper::~AssertHelper(&local_3e8);
                std::__cxx11::string::~string((string *)(priv.opaque.bytes + 0x1e58));
                testing::Message::~Message(&local_3e0);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_4da0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        &public_key_expected.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_4da8 = 0x30;
                testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                          ((EqHelper *)local_4d98,"seed.size()","size_t{48}",&local_4da0,&local_4da8
                          );
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_4d98);
                if (!bVar1) {
                  testing::Message::Message(&local_4db0);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4d98);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&state,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                             ,0x8b,pcVar2);
                  testing::internal::AssertHelper::operator=((AssertHelper *)&state,&local_4db0);
                  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&state);
                  testing::Message::~Message(&local_4db0);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d98);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  entropy = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &public_key_expected.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  __p = CTR_DRBG_new(entropy,(uint8_t *)0x0,0);
                  std::unique_ptr<ctr_drbg_state_st,bssl::internal::Deleter>::
                  unique_ptr<bssl::internal::Deleter,void>
                            ((unique_ptr<ctr_drbg_state_st,bssl::internal::Deleter> *)
                             &gtest_ar__7.message_,__p);
                  testing::AssertionResult::
                  AssertionResult<std::unique_ptr<ctr_drbg_state_st,bssl::internal::Deleter>>
                            ((AssertionResult *)local_4dd0,
                             (unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)
                             &gtest_ar__7.message_,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_4dd0);
                  if (!bVar1) {
                    testing::Message::Message(&local_4dd8);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)&gtest_ar__8.message_,(internal *)local_4dd0,
                               (AssertionResult *)"state","false","true",in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_4de0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                               ,0x90,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_4de0,&local_4dd8);
                    testing::internal::AssertHelper::~AssertHelper(&local_4de0);
                    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_4dd8);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4dd0);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    pcVar3 = std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)
                                        &gtest_ar__7.message_);
                    local_4e14 = CTR_DRBG_generate(pcVar3,encap_entropy + 0x18,0x20,(uint8_t *)0x0,0
                                                  );
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_4e10,&local_4e14,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4e10);
                    if (!bVar1) {
                      testing::Message::Message(&local_4e20);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__9.message_,(internal *)local_4e10,
                                 (AssertionResult *)
                                 "CTR_DRBG_generate(state.get(), gen_key_entropy, 32, nullptr, 0)",
                                 "false","true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_4e28,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                 ,0x92,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_4e28,&local_4e20);
                      testing::internal::AssertHelper::~AssertHelper(&local_4e28);
                      std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                      testing::Message::~Message(&local_4e20);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e10);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      pcVar3 = std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::get
                                         ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)
                                          &gtest_ar__7.message_);
                      local_4e5c = CTR_DRBG_generate(pcVar3,gen_key_entropy + 0x18,0x20,
                                                     (uint8_t *)0x0,0);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_4e58,&local_4e5c,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_4e58);
                      if (!bVar1) {
                        testing::Message::Message(&local_4e68);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar__10.message_,(internal *)local_4e58,
                                   (AssertionResult *)
                                   "CTR_DRBG_generate(state.get(), gen_key_entropy + 32, 32, nullptr, 0)"
                                   ,"false","true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_4e70,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                   ,0x94,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_4e70,&local_4e68);
                        testing::internal::AssertHelper::~AssertHelper(&local_4e70);
                        std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                        testing::Message::~Message(&local_4e68);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e58);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        pcVar3 = std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::get
                                           ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>
                                             *)&gtest_ar__7.message_);
                        local_4ea4 = CTR_DRBG_generate(pcVar3,encapsulated_key + 0x18,0x20,
                                                       (uint8_t *)0x0,0);
                        testing::AssertionResult::AssertionResult<int>
                                  ((AssertionResult *)local_4ea0,&local_4ea4,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_4ea0);
                        if (!bVar1) {
                          testing::Message::Message(&local_4eb0);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)&gtest_ar_1.message_,(internal *)local_4ea0,
                                     (AssertionResult *)
                                     "CTR_DRBG_generate(state.get(), encap_entropy, 32, nullptr, 0)"
                                     ,"false","true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_4eb8,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0x96,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_4eb8,&local_4eb0);
                          testing::internal::AssertHelper::~AssertHelper(&local_4eb8);
                          std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                          testing::Message::~Message(&local_4eb0);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_4ea0);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ = 0;
                        }
                      }
                    }
                  }
                  std::unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter>::~unique_ptr
                            ((unique_ptr<ctr_drbg_state_st,_bssl::internal::Deleter> *)
                             &gtest_ar__7.message_);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    bssl::Span<unsigned_char_const>::Span<64ul>
                              ((Span<unsigned_char_const> *)&local_4f30,
                               (uchar (*) [64])(encap_entropy + 0x18));
                    Declassified(&local_4f20,local_4f30);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_4f08,&local_4f20);
                    Bytes::Bytes(&local_4ef8,local_4f08);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_4f50,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &given_encap_entropy_pre_hash.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                    Bytes::Bytes(&local_4f40,local_4f50);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_4ee8,"Bytes(Declassified(gen_key_entropy))",
                               "Bytes(given_generate_entropy)",&local_4ef8,&local_4f40);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4f20)
                    ;
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4ee8);
                    if (!bVar1) {
                      testing::Message::Message(&local_4f58);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_4ee8);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                 ,0x9a,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_2.message_,&local_4f58);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_2.message_);
                      testing::Message::~Message(&local_4f58);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4ee8);
                    bssl::Span<unsigned_char_const>::Span<32ul>
                              ((Span<unsigned_char_const> *)&local_4fb8,
                               (uchar (*) [32])(encapsulated_key + 0x18));
                    Declassified(&local_4fa8,local_4fb8);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_4f90,&local_4fa8);
                    Bytes::Bytes(&local_4f80,local_4f90);
                    bssl::Span<unsigned_char_const>::
                    Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              ((Span<unsigned_char_const> *)&local_4fd8,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
                    Bytes::Bytes(&local_4fc8,local_4fd8);
                    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                              ((EqHelper *)local_4f70,"Bytes(Declassified(encap_entropy))",
                               "Bytes(given_encap_entropy_pre_hash)",&local_4f80,&local_4fc8);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4fa8)
                    ;
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_4f70);
                    if (!bVar1) {
                      testing::Message::Message(&local_4fe0);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_4f70);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)((long)&cbb.u + 0x18),kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                 ,0x9c,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)((long)&cbb.u + 0x18),&local_4fe0);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)((long)&cbb.u + 0x18));
                      testing::Message::~Message(&local_4fe0);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f70);
                    BORINGSSL_keccak(encapsulated_key + 0x18,0x20,encapsulated_key + 0x18,0x20,
                                     boringssl_sha3_256);
                    KYBER_generate_key_external_entropy
                              (ciphertext + 0x438,(KYBER_private_key *)(encoded_private_key + 0x958)
                               ,encap_entropy + 0x18);
                    CBB_init_fixed((CBB *)&gtest_ar__11.message_,pub.opaque.bytes + 0x1838,0x960);
                    local_502c = KYBER_marshal_private_key
                                           ((CBB *)&gtest_ar__11.message_,
                                            (KYBER_private_key *)(encoded_private_key + 0x958));
                    testing::AssertionResult::AssertionResult<int>
                              ((AssertionResult *)local_5028,&local_502c,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_5028);
                    if (!bVar1) {
                      testing::Message::Message(&local_5038);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&encoded_public_key_cbs.len,(internal *)local_5028,
                                 (AssertionResult *)"KYBER_marshal_private_key(&cbb, &priv)","false"
                                 ,"true",in_R9);
                      pcVar2 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_5040,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                 ,0xa5,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_5040,&local_5038);
                      testing::internal::AssertHelper::~AssertHelper(&local_5040);
                      std::__cxx11::string::~string((string *)&encoded_public_key_cbs.len);
                      testing::Message::~Message(&local_5038);
                    }
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_5028);
                    if (gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      CBS_init((CBS *)&gtest_ar__12.message_,ciphertext + 0x438,0x4a0);
                      local_5084 = KYBER_parse_public_key
                                             ((KYBER_public_key *)(encoded_public_key + 0x498),
                                              (CBS *)&gtest_ar__12.message_);
                      testing::AssertionResult::AssertionResult<int>
                                ((AssertionResult *)local_5080,&local_5084,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_5080);
                      if (!bVar1) {
                        testing::Message::Message(&local_5090);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_3.message_,(internal *)local_5080,
                                   (AssertionResult *)
                                   "KYBER_parse_public_key(&pub, &encoded_public_key_cbs)","false",
                                   "true",in_R9);
                        pcVar2 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_5098,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                   ,0xa9,pcVar2);
                        testing::internal::AssertHelper::operator=(&local_5098,&local_5090);
                        testing::internal::AssertHelper::~AssertHelper(&local_5098);
                        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                        testing::Message::~Message(&local_5090);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5080);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        KYBER_encap_external_entropy
                                  (gen_key_entropy + 0x38,decapsulated_key + 0x18,
                                   (KYBER_public_key *)(encoded_public_key + 0x498),
                                   encapsulated_key + 0x18);
                        KYBER_decap((uint8_t *)&gtest_ar.message_,gen_key_entropy + 0x38,
                                    (KYBER_private_key *)(encoded_private_key + 0x958));
                        bssl::Span<unsigned_char_const>::Span<32ul>
                                  ((Span<unsigned_char_const> *)&local_5110,
                                   (uchar (*) [32])(decapsulated_key + 0x18));
                        Declassified(&local_5100,local_5110);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_50e8,&local_5100);
                        Bytes::Bytes(&local_50d8,local_50e8);
                        bssl::Span<unsigned_char_const>::Span<32ul>
                                  ((Span<unsigned_char_const> *)&local_5158,
                                   (uchar (*) [32])&gtest_ar.message_);
                        Declassified(&local_5148,local_5158);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_5130,&local_5148);
                        Bytes::Bytes(&local_5120,local_5130);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_50c8,"Bytes(Declassified(encapsulated_key))",
                                   "Bytes(Declassified(decapsulated_key))",&local_50d8,&local_5120);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  (&local_5148);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  (&local_5100);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_50c8);
                        if (!bVar1) {
                          testing::Message::Message(&local_5160);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_50c8);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0xaf,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_4.message_,&local_5160);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_4.message_);
                          testing::Message::~Message(&local_5160);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_50c8);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_5198,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &ciphertext_expected.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        Bytes::Bytes(&local_5188,local_5198);
                        bssl::Span<unsigned_char_const>::Span<2400ul>
                                  ((Span<unsigned_char_const> *)&local_51e0,
                                   (uchar (*) [2400])((long)&pub.opaque + 0x1838));
                        Declassified(&local_51d0,local_51e0);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_51b8,&local_51d0);
                        Bytes::Bytes(&local_51a8,local_51b8);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_5178,"Bytes(private_key_expected)",
                                   "Bytes(Declassified(encoded_private_key))",&local_5188,
                                   &local_51a8);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  (&local_51d0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_5178);
                        if (!bVar1) {
                          testing::Message::Message(&local_51e8);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_5178);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0xb1,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_5.message_,&local_51e8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_5.message_);
                          testing::Message::~Message(&local_51e8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5178);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_5220,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &private_key_expected.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        Bytes::Bytes(&local_5210,local_5220);
                        bssl::Span<unsigned_char_const>::Span<1184ul>
                                  ((Span<unsigned_char_const> *)&local_5240,
                                   (uchar (*) [1184])(ciphertext + 0x438));
                        Bytes::Bytes(&local_5230,local_5240);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_5200,"Bytes(public_key_expected)",
                                   "Bytes(encoded_public_key)",&local_5210,&local_5230);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_5200);
                        if (!bVar1) {
                          testing::Message::Message(&local_5248);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_5200);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0xb2,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_6.message_,&local_5248);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_6.message_);
                          testing::Message::~Message(&local_5248);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5200);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_5280,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &shared_secret_expected.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        Bytes::Bytes(&local_5270,local_5280);
                        bssl::Span<unsigned_char_const>::Span<1088ul>
                                  ((Span<unsigned_char_const> *)&local_52a0,
                                   (uchar (*) [1088])(gen_key_entropy + 0x38));
                        Bytes::Bytes(&local_5290,local_52a0);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_5260,"Bytes(ciphertext_expected)",
                                   "Bytes(ciphertext)",&local_5270,&local_5290);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_5260);
                        if (!bVar1) {
                          testing::Message::Message(&local_52a8);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_5260);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0xb3,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_7.message_,&local_52a8);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_7.message_);
                          testing::Message::~Message(&local_52a8);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_5260);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_52e0,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   &given_generate_entropy.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                        Bytes::Bytes(&local_52d0,local_52e0);
                        bssl::Span<unsigned_char_const>::Span<32ul>
                                  ((Span<unsigned_char_const> *)&local_5328,
                                   (uchar (*) [32])(decapsulated_key + 0x18));
                        Declassified(&local_5318,local_5328);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_5300,&local_5318);
                        Bytes::Bytes(&local_52f0,local_5300);
                        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                                  ((EqHelper *)local_52c0,"Bytes(shared_secret_expected)",
                                   "Bytes(Declassified(encapsulated_key))",&local_52d0,&local_52f0);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  (&local_5318);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_52c0);
                        if (!bVar1) {
                          testing::Message::Message(&local_5330);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_52c0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)(corrupted_ciphertext + 0x438),kNonFatalFailure
                                     ,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0xb5,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)(corrupted_ciphertext + 0x438),&local_5330);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)(corrupted_ciphertext + 0x438));
                          testing::Message::~Message(&local_5330);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_52c0);
                        OPENSSL_memcpy(corrupted_decapsulated_key + 0x18,gen_key_entropy + 0x38,
                                       0x440);
                        corrupted_decapsulated_key[0x1b] = corrupted_decapsulated_key[0x1b] ^ 0x40;
                        KYBER_decap((uint8_t *)&gtest_ar_8.message_,
                                    corrupted_decapsulated_key + 0x18,
                                    (KYBER_private_key *)(encoded_private_key + 0x958));
                        bssl::Span<unsigned_char_const>::Span<32ul>
                                  ((Span<unsigned_char_const> *)&local_57f0,
                                   (uchar (*) [32])(decapsulated_key + 0x18));
                        Declassified(&local_57e0,local_57f0);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_57c8,&local_57e0);
                        Bytes::Bytes(&local_57b8,local_57c8);
                        bssl::Span<unsigned_char_const>::Span<32ul>
                                  ((Span<unsigned_char_const> *)&local_5838,
                                   (uchar (*) [32])&gtest_ar_8.message_);
                        Declassified(&local_5828,local_5838);
                        bssl::Span<unsigned_char_const>::
                        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  ((Span<unsigned_char_const> *)&local_5810,&local_5828);
                        Bytes::Bytes(&local_5800,local_5810);
                        testing::internal::CmpHelperNE<Bytes,Bytes>
                                  ((internal *)local_57a8,"Bytes(Declassified(encapsulated_key))",
                                   "Bytes(Declassified(corrupted_decapsulated_key))",&local_57b8,
                                   &local_5800);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  (&local_5828);
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                                  (&local_57e0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_57a8);
                        if (!bVar1) {
                          testing::Message::Message(&local_5840);
                          pcVar2 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_57a8);
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_5848,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber_test.cc"
                                     ,0xc0,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_5848,&local_5840);
                          testing::internal::AssertHelper::~AssertHelper(&local_5848);
                          testing::Message::~Message(&local_5840);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_57a8);
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &given_encap_entropy_pre_hash.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &given_generate_entropy.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &shared_secret_expected.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &ciphertext_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &private_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &public_key_expected.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

static void KyberFileTest(FileTest *t) {
  std::vector<uint8_t> seed, public_key_expected, private_key_expected,
      ciphertext_expected, shared_secret_expected, given_generate_entropy,
      given_encap_entropy_pre_hash;
  t->IgnoreAttribute("count");
  ASSERT_TRUE(t->GetBytes(&seed, "seed"));
  ASSERT_TRUE(t->GetBytes(&public_key_expected, "pk"));
  ASSERT_TRUE(t->GetBytes(&private_key_expected, "sk"));
  ASSERT_TRUE(t->GetBytes(&ciphertext_expected, "ct"));
  ASSERT_TRUE(t->GetBytes(&shared_secret_expected, "ss"));
  ASSERT_TRUE(t->GetBytes(&given_generate_entropy, "generateEntropy"));
  ASSERT_TRUE(
      t->GetBytes(&given_encap_entropy_pre_hash, "encapEntropyPreHash"));

  KYBER_private_key priv;
  uint8_t encoded_private_key[KYBER_PRIVATE_KEY_BYTES];
  KYBER_public_key pub;
  uint8_t encoded_public_key[KYBER_PUBLIC_KEY_BYTES];
  uint8_t ciphertext[KYBER_CIPHERTEXT_BYTES];
  uint8_t gen_key_entropy[KYBER_GENERATE_KEY_ENTROPY];
  uint8_t encap_entropy[KYBER_ENCAP_ENTROPY];
  uint8_t encapsulated_key[KYBER_SHARED_SECRET_BYTES];
  uint8_t decapsulated_key[KYBER_SHARED_SECRET_BYTES];
  // The test vectors provide a CTR-DRBG seed which is used to generate the
  // input entropy.
  ASSERT_EQ(seed.size(), size_t{CTR_DRBG_ENTROPY_LEN});
  CONSTTIME_SECRET(seed.data(), seed.size());
  {
    bssl::UniquePtr<CTR_DRBG_STATE> state(
        CTR_DRBG_new(seed.data(), nullptr, 0));
    ASSERT_TRUE(state);
    ASSERT_TRUE(
        CTR_DRBG_generate(state.get(), gen_key_entropy, 32, nullptr, 0));
    ASSERT_TRUE(
        CTR_DRBG_generate(state.get(), gen_key_entropy + 32, 32, nullptr, 0));
    ASSERT_TRUE(CTR_DRBG_generate(state.get(), encap_entropy,
                                  KYBER_ENCAP_ENTROPY, nullptr, 0));
  }

  EXPECT_EQ(Bytes(Declassified(gen_key_entropy)),
            Bytes(given_generate_entropy));
  EXPECT_EQ(Bytes(Declassified(encap_entropy)),
            Bytes(given_encap_entropy_pre_hash));

  BORINGSSL_keccak(encap_entropy, sizeof(encap_entropy), encap_entropy,
                   sizeof(encap_entropy), boringssl_sha3_256);

  KYBER_generate_key_external_entropy(encoded_public_key, &priv,
                                      gen_key_entropy);
  CBB cbb;
  CBB_init_fixed(&cbb, encoded_private_key, sizeof(encoded_private_key));
  ASSERT_TRUE(KYBER_marshal_private_key(&cbb, &priv));
  CBS encoded_public_key_cbs;
  CBS_init(&encoded_public_key_cbs, encoded_public_key,
           sizeof(encoded_public_key));
  ASSERT_TRUE(KYBER_parse_public_key(&pub, &encoded_public_key_cbs));
  KYBER_encap_external_entropy(ciphertext, encapsulated_key, &pub,
                               encap_entropy);
  KYBER_decap(decapsulated_key, ciphertext, &priv);

  EXPECT_EQ(Bytes(Declassified(encapsulated_key)),
            Bytes(Declassified(decapsulated_key)));
  EXPECT_EQ(Bytes(private_key_expected),
            Bytes(Declassified(encoded_private_key)));
  EXPECT_EQ(Bytes(public_key_expected), Bytes(encoded_public_key));
  EXPECT_EQ(Bytes(ciphertext_expected), Bytes(ciphertext));
  EXPECT_EQ(Bytes(shared_secret_expected),
            Bytes(Declassified(encapsulated_key)));

  uint8_t corrupted_ciphertext[KYBER_CIPHERTEXT_BYTES];
  OPENSSL_memcpy(corrupted_ciphertext, ciphertext, KYBER_CIPHERTEXT_BYTES);
  corrupted_ciphertext[3] ^= 0x40;
  uint8_t corrupted_decapsulated_key[KYBER_SHARED_SECRET_BYTES];
  KYBER_decap(corrupted_decapsulated_key, corrupted_ciphertext, &priv);
  // It would be nice to have actual test vectors for the failure case, but the
  // NIST submission currently does not include those, so we are just testing
  // for inequality.
  EXPECT_NE(Bytes(Declassified(encapsulated_key)),
            Bytes(Declassified(corrupted_decapsulated_key)));
}